

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O3

void handle_mp_dump(BinarySource *in,strbuf *out)

{
  byte bVar1;
  mp_int *x;
  size_t byte;
  
  x = get_val_mpint(in);
  byte = mp_max_bytes(x);
  if (byte != 0) {
    do {
      byte = byte - 1;
      bVar1 = mp_get_byte(x,byte);
      BinarySink_put_fmt(out->binarysink_,"%02X",(ulong)bVar1);
    } while (byte != 0);
  }
  BinarySink_put_byte(out->binarysink_,'\n');
  return;
}

Assistant:

static void handle_mp_dump(BinarySource *in, strbuf *out)
{
    mp_int *mp = get_val_mpint(in);
    for (size_t i = mp_max_bytes(mp); i-- > 0 ;)
        put_fmt(out, "%02X", mp_get_byte(mp, i));
    put_byte(out, '\n');
}